

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O1

RPCHelpMan * sendrawtransaction(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_00;
  string description_01;
  string description_02;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar4 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  RPCHelpMan *in_RDI;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff4b8;
  undefined8 in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4d0;
  undefined8 in_stack_fffffffffffff4d8;
  code *pcVar11;
  undefined8 in_stack_fffffffffffff4e0;
  pointer in_stack_fffffffffffff4e8;
  pointer pRVar12;
  pointer in_stack_fffffffffffff4f0;
  pointer pRVar13;
  pointer in_stack_fffffffffffff4f8;
  pointer pRVar14;
  undefined1 in_stack_fffffffffffff500 [16];
  _Vector_impl_data in_stack_fffffffffffff510;
  undefined1 in_stack_fffffffffffff528 [16];
  pointer in_stack_fffffffffffff538;
  _Alloc_hider in_stack_fffffffffffff540;
  _Alloc_hider _Var15;
  size_type in_stack_fffffffffffff548;
  undefined8 in_stack_fffffffffffff550;
  undefined8 in_stack_fffffffffffff558;
  _Alloc_hider in_stack_fffffffffffff560;
  _Alloc_hider _Var16;
  size_type in_stack_fffffffffffff568;
  undefined8 in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff578;
  _Alloc_hider in_stack_fffffffffffff580;
  size_type in_stack_fffffffffffff588;
  undefined8 in_stack_fffffffffffff590;
  undefined8 in_stack_fffffffffffff598;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  ulong *local_880;
  undefined8 local_878;
  ulong local_870;
  undefined8 uStack_868;
  ulong *local_860;
  size_type local_858;
  ulong local_850;
  undefined8 uStack_848;
  long *local_840 [2];
  long local_830 [2];
  long *local_820 [2];
  long local_810 [2];
  RPCResult local_800;
  undefined1 local_778;
  undefined1 *local_770;
  undefined8 local_768;
  undefined1 local_760;
  undefined7 uStack_75f;
  undefined1 local_750 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  size_type *local_710;
  size_type local_708;
  size_type local_700;
  undefined8 uStack_6f8;
  string local_6f0;
  UniValue local_6d0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_678;
  undefined1 local_620;
  long *local_618 [2];
  long local_608 [2];
  undefined1 local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5e0;
  undefined7 uStack_5df;
  undefined1 local_5d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  size_type *local_590;
  size_type local_588;
  size_type local_580;
  undefined8 uStack_578;
  string local_570;
  UniValue local_550;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sendrawtransaction","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nSubmit a raw transaction (serialized, hex-encoded) to local node and network.\n\nThe transaction will be sent unconditionally to all peers, so using sendrawtransaction\nfor manual rebroadcast may degrade privacy by leaking the transaction\'s origin, as\nnodes will normally not rebroadcast non-wallet transactions already in their mempool.\n\nA specific exception, RPC_TRANSACTION_ALREADY_IN_UTXO_SET, may throw if the transaction cannot be added to the mempool.\n\nRelated RPCs: createrawtransaction, signrawtransactionwithkey\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"hexstring","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,"The hex string of the raw transaction","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff4e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff4f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff500;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_00._M_string_length = (size_type)in_stack_fffffffffffff540._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff548;
  description_00.field_2._8_8_ = in_stack_fffffffffffff550;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff560._M_p;
  opts._0_8_ = in_stack_fffffffffffff558;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff568;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff570;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff578;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff580._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff588;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff590;
  opts.hidden = (bool)(char)in_stack_fffffffffffff598;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff598 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff598 >> 0x10);
  RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_00,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"maxfeerate","");
  FormatMoney_abi_cxx11_(&local_570,node::DEFAULT_MAX_RAW_TX_FEE_RATE);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_550,&local_570);
  paVar7 = &local_550.val.field_2;
  local_4f8._8_8_ = (long)&local_4f8 + 0x18;
  local_4f8._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_550.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.val._M_dataplus._M_p == paVar7) {
    local_4f8._32_8_ = local_550.val.field_2._8_8_;
  }
  else {
    local_4f8._8_8_ = local_550.val._M_dataplus._M_p;
  }
  local_4f8._16_8_ = local_550.val._M_string_length;
  local_550.val._M_string_length = 0;
  local_550.val.field_2._M_local_buf[0] = '\0';
  local_4f8._40_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4f8._48_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4f8._56_8_ =
       local_550.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_550.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8._64_8_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_4f8._72_8_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_4f8._80_8_ =
       local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_550.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a0 = 2;
  local_550.val._M_dataplus._M_p = (pointer)paVar7;
  std::operator+(&local_5b0,
                 "Reject transactions whose fee rate is higher than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_5b0,
                      "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."
                     );
  local_590 = &local_580;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_580 = paVar7->_M_allocated_capacity;
    uStack_578 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_580 = paVar7->_M_allocated_capacity;
    local_590 = psVar1;
  }
  local_588 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_5f0 = &local_5e0;
  local_5f8 = 0;
  local_5e8 = 0;
  local_5e0 = 0;
  local_5d0._0_8_ = (pointer)0x0;
  local_5d0._8_2_ = 0;
  local_5d0._10_6_ = 0;
  local_5d0._16_2_ = 0;
  local_5d0._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff4e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff4f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff500;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_01._M_string_length = (size_type)in_stack_fffffffffffff540._M_p;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff548;
  description_01.field_2._8_8_ = in_stack_fffffffffffff550;
  opts_00.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff560._M_p;
  opts_00._0_8_ = in_stack_fffffffffffff558;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff568;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff570;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff578;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff580._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff588;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff590;
  opts_00.hidden = (bool)(char)in_stack_fffffffffffff598;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff598 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_fffffffffffff598 >> 0x10);
  RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_01,opts_00);
  local_618[0] = local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"maxburnamount","");
  FormatMoney_abi_cxx11_(&local_6f0,0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_6d0,&local_6f0);
  paVar7 = &local_6d0.val.field_2;
  local_678._8_8_ = (long)&local_678 + 0x18;
  local_678._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_6d0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.val._M_dataplus._M_p == paVar7) {
    local_678._32_8_ = local_6d0.val.field_2._8_8_;
  }
  else {
    local_678._8_8_ = local_6d0.val._M_dataplus._M_p;
  }
  local_678._16_8_ = local_6d0.val._M_string_length;
  local_6d0.val._M_string_length = 0;
  local_6d0.val.field_2._M_local_buf[0] = '\0';
  local_678._40_8_ =
       local_6d0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_678._48_8_ =
       local_6d0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_678._56_8_ =
       local_6d0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6d0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_678._64_8_ =
       local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_678._72_8_ =
       local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_678._80_8_ =
       local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_620 = 2;
  local_6d0.val._M_dataplus._M_p = (pointer)paVar7;
  std::operator+(&local_730,
                 "Reject transactions with provably unspendable outputs (e.g. \'datacarrier\' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_730,
                      ".\nIf burning funds through unspendable outputs is desired, increase this value.\nThis check is based on heuristics and does not guarantee spendability of outputs.\n"
                     );
  local_710 = &local_700;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_700 = paVar7->_M_allocated_capacity;
    uStack_6f8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_700 = paVar7->_M_allocated_capacity;
    local_710 = psVar1;
  }
  local_708 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_770 = &local_760;
  local_778 = 0;
  local_768 = 0;
  local_760 = 0;
  local_750._0_8_ = (pointer)0x0;
  local_750._8_2_ = 0;
  local_750._10_6_ = 0;
  local_750._16_2_ = 0;
  local_750._18_8_ = 0;
  name_01._M_string_length = (size_type)in_RDI;
  name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name_01.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff4e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff4f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff500;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff510._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff510._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff528;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff540._M_p;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
  description_02.field_2._M_allocated_capacity = in_stack_fffffffffffff548;
  description_02.field_2._8_8_ = in_stack_fffffffffffff550;
  opts_01.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff560._M_p;
  opts_01._0_8_ = in_stack_fffffffffffff558;
  opts_01.oneline_description._M_string_length = in_stack_fffffffffffff568;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff570;
  opts_01.oneline_description.field_2._8_8_ = in_stack_fffffffffffff578;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff580._M_p;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff588;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff590;
  opts_01.hidden = (bool)(char)in_stack_fffffffffffff598;
  opts_01.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff598 >> 8);
  opts_01._66_6_ = (int6)((ulong)in_stack_fffffffffffff598 >> 0x10);
  RPCArg::RPCArg(&local_180,name_01,(Type)local_618,fallback_01,description_02,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff528,__l,
             (allocator_type *)&stack0xfffffffffffff527);
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_840,"The transaction hash in hex","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  auVar4._16_8_ = 0;
  auVar4._0_16_ = in_stack_fffffffffffff500;
  RPCResult::RPCResult
            (&local_800,STR_HEX,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar4 << 0x40),SUB81(local_820,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff4b8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff4c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  result._64_8_ = pRVar14;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff500._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff500._8_8_;
  result._88_24_ = in_stack_fffffffffffff510;
  result.m_cond._8_16_ = in_stack_fffffffffffff528;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff538;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff508,result);
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"createrawtransaction","");
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9a0,
             "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"","")
  ;
  HelpExampleCli(&local_960,&local_980,&local_9a0);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_960,0,0,"\nCreate a transaction\n",0x16);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar7 == paVar8) {
    local_940.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_940.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_940.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_940._M_dataplus._M_p = (pointer)paVar7;
  }
  local_940._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_940,"Sign the transaction, and get back the hex\n");
  local_920._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p == paVar7) {
    local_920.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_920.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_920.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  }
  else {
    local_920.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_920._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9e0,"signrawtransactionwithwallet","");
  local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"\"myhex\"","");
  HelpExampleCli(&local_9c0,&local_9e0,&local_a00);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    uVar9 = local_920.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_9c0._M_string_length + local_920._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
      uVar9 = local_9c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_9c0._M_string_length + local_920._M_string_length) goto LAB_002f9dda;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_9c0,0,0,local_920._M_dataplus._M_p,local_920._M_string_length);
  }
  else {
LAB_002f9dda:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_920,local_9c0._M_dataplus._M_p,local_9c0._M_string_length);
  }
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar8 == paVar7) {
    local_900.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_900.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_900.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_900._M_dataplus._M_p = (pointer)paVar8;
  }
  local_900._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_900,"\nSend the transaction (signed hex)\n");
  local_8e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p == paVar7) {
    local_8e0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_8e0.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_8e0.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  }
  else {
    local_8e0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_8e0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"sendrawtransaction","");
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"\"signedhex\"","");
  HelpExampleCli(&local_a20,&local_a40,&local_a60);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    uVar9 = local_8e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_a20._M_string_length + local_8e0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
      uVar9 = local_a20.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_a20._M_string_length + local_8e0._M_string_length) goto LAB_002f9f79;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_a20,0,0,local_8e0._M_dataplus._M_p,local_8e0._M_string_length);
  }
  else {
LAB_002f9f79:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_8e0,local_a20._M_dataplus._M_p,local_a20._M_string_length);
  }
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar8 == paVar7) {
    local_8c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_8c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_8c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_8c0._M_dataplus._M_p = (pointer)paVar8;
  }
  local_8c0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_8c0,"\nAs a JSON-RPC call\n");
  paVar7 = &local_8a0.field_2;
  local_8a0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p == paVar8) {
    local_8a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_8a0.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_8a0.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    local_8a0._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_8a0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_8a0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  _Var16._M_p = &stack0xfffffffffffff570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff560,"sendrawtransaction","");
  _Var15._M_p = &stack0xfffffffffffff550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff540,"\"signedhex\"","");
  HelpExampleRpc((string *)&stack0xfffffffffffff580,(string *)&stack0xfffffffffffff560,
                 (string *)&stack0xfffffffffffff540);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != paVar7) {
    uVar9 = local_8a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < in_stack_fffffffffffff588 + local_8a0._M_string_length) {
    uVar9 = 0xf;
    if (in_stack_fffffffffffff580._M_p != &stack0xfffffffffffff590) {
      uVar9 = in_stack_fffffffffffff590;
    }
    if (in_stack_fffffffffffff588 + local_8a0._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff580,0,0,local_8a0._M_dataplus._M_p,
                       local_8a0._M_string_length);
      goto LAB_002fa142;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_8a0,in_stack_fffffffffffff580._M_p,in_stack_fffffffffffff588);
LAB_002fa142:
  local_880 = &local_870;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar8) {
    local_870 = paVar8->_M_allocated_capacity;
    uStack_868 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_870 = paVar8->_M_allocated_capacity;
    local_880 = puVar2;
  }
  local_858 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  if (local_880 == &local_870) {
    uStack_848 = uStack_868;
    local_860 = &local_850;
  }
  else {
    local_860 = local_880;
  }
  local_850 = local_870;
  local_878 = 0;
  local_870 = local_870 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:71:9)>
            ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:71:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:71:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar12;
  description.field_2._8_8_ = pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff500._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff500._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar14;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff538;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff528._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff528._8_8_;
  examples.m_examples.field_2._8_8_ = _Var15._M_p;
  local_880 = &local_870;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff4c8)),description,args,
             (RPCResults)in_stack_fffffffffffff510,examples,(RPCMethodImpl *)&local_58);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xfffffffffffff4c8,&stack0xfffffffffffff4c8,3);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860,local_850 + 1);
  }
  if (local_880 != &local_870) {
    operator_delete(local_880,local_870 + 1);
  }
  if (in_stack_fffffffffffff580._M_p != &stack0xfffffffffffff590) {
    operator_delete(in_stack_fffffffffffff580._M_p,in_stack_fffffffffffff590 + 1);
  }
  if (_Var15._M_p != &stack0xfffffffffffff550) {
    operator_delete(_Var15._M_p,in_stack_fffffffffffff550 + 1);
  }
  if (_Var16._M_p != &stack0xfffffffffffff570) {
    operator_delete(_Var16._M_p,in_stack_fffffffffffff570 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != paVar7) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
    operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff508);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_cond._M_dataplus._M_p != &local_800.m_cond.field_2) {
    operator_delete(local_800.m_cond._M_dataplus._M_p,
                    local_800.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_description._M_dataplus._M_p != &local_800.m_description.field_2) {
    operator_delete(local_800.m_description._M_dataplus._M_p,
                    local_800.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_800.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_key_name._M_dataplus._M_p != &local_800.m_key_name.field_2) {
    operator_delete(local_800.m_key_name._M_dataplus._M_p,
                    local_800.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4e8);
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff528);
  lVar10 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar10));
    plVar3 = *(long **)((long)&local_410 + lVar10 + 0x40);
    plVar6 = (long *)((long)&local_410 + lVar10 + 0x50);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_410 + lVar10 + 0x28);
    plVar3 = *(long **)((long)&local_410 + lVar10 + 0x18);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar10));
    if ((long *)((long)local_488 + lVar10) != *(long **)((long)local_498 + lVar10)) {
      operator_delete(*(long **)((long)local_498 + lVar10),*(long *)((long)local_488 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_750);
  if (local_770 != &local_760) {
    operator_delete(local_770,CONCAT71(uStack_75f,local_760) + 1);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710,local_700 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_678._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.val._M_dataplus._M_p != &local_6d0.val.field_2) {
    operator_delete(local_6d0.val._M_dataplus._M_p,
                    CONCAT71(local_6d0.val.field_2._M_allocated_capacity._1_7_,
                             local_6d0.val.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if (local_618[0] != local_608) {
    operator_delete(local_618[0],local_608[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5d0);
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,CONCAT71(uStack_5df,local_5e0) + 1);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590,local_580 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_550.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_550.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.val._M_dataplus._M_p != &local_550.val.field_2) {
    operator_delete(local_550.val._M_dataplus._M_p,
                    CONCAT71(local_550.val.field_2._M_allocated_capacity._1_7_,
                             local_550.val.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan sendrawtransaction()
{
    return RPCHelpMan{"sendrawtransaction",
        "\nSubmit a raw transaction (serialized, hex-encoded) to local node and network.\n"
        "\nThe transaction will be sent unconditionally to all peers, so using sendrawtransaction\n"
        "for manual rebroadcast may degrade privacy by leaking the transaction's origin, as\n"
        "nodes will normally not rebroadcast non-wallet transactions already in their mempool.\n"
        "\nA specific exception, RPC_TRANSACTION_ALREADY_IN_UTXO_SET, may throw if the transaction cannot be added to the mempool.\n"
        "\nRelated RPCs: createrawtransaction, signrawtransactionwithkey\n",
        {
            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hex string of the raw transaction"},
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
            {"maxburnamount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_BURN_AMOUNT)},
             "Reject transactions with provably unspendable outputs (e.g. 'datacarrier' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in " + CURRENCY_UNIT + ".\n"
             "If burning funds through unspendable outputs is desired, increase this value.\n"
             "This check is based on heuristics and does not guarantee spendability of outputs.\n"},
        },
        RPCResult{
            RPCResult::Type::STR_HEX, "", "The transaction hash in hex"
        },
        RPCExamples{
            "\nCreate a transaction\n"
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"") +
            "Sign the transaction, and get back the hex\n"
            + HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"") +
            "\nSend the transaction (signed hex)\n"
            + HelpExampleCli("sendrawtransaction", "\"signedhex\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("sendrawtransaction", "\"signedhex\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const CAmount max_burn_amount = request.params[2].isNull() ? 0 : AmountFromValue(request.params[2]);

            CMutableTransaction mtx;
            if (!DecodeHexTx(mtx, request.params[0].get_str())) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed. Make sure the tx has at least one input.");
            }

            for (const auto& out : mtx.vout) {
                if((out.scriptPubKey.IsUnspendable() || !out.scriptPubKey.HasValidOps()) && out.nValue > max_burn_amount) {
                    throw JSONRPCTransactionError(TransactionError::MAX_BURN_EXCEEDED);
                }
            }

            CTransactionRef tx(MakeTransactionRef(std::move(mtx)));

            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};

            int64_t virtual_size = GetVirtualTransactionSize(*tx);
            CAmount max_raw_tx_fee = max_raw_tx_fee_rate.GetFee(virtual_size);

            std::string err_string;
            AssertLockNotHeld(cs_main);
            NodeContext& node = EnsureAnyNodeContext(request.context);
            const TransactionError err = BroadcastTransaction(node, tx, err_string, max_raw_tx_fee, /*relay=*/true, /*wait_callback=*/true);
            if (TransactionError::OK != err) {
                throw JSONRPCTransactionError(err, err_string);
            }

            return tx->GetHash().GetHex();
        },
    };
}